

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

void sptk::swipe::Sfirst(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps
                        ,double nyquist,double nyquist2,double dt,int n)

{
  uint uVar1;
  vector pci;
  vector mu;
  int w2;
  uint xSz;
  ulong uVar2;
  double *pdVar3;
  double **extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  vector fERBs_00;
  matrix L;
  vector vVar5;
  vector vVar6;
  vector yr_vector;
  matrix yr_matrix;
  vector yr_vector_00;
  vector yr_vector_01;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  double *pdVar4;
  
  w2 = ws.v[n] / 2;
  vVar6._4_4_ = 0;
  vVar6.x = fERBs.x;
  vVar5._4_4_ = 0;
  vVar5.x = x.x;
  vVar5.v = x.v;
  vVar6.v = fERBs.v;
  L = loudness(vVar5,vVar6,nyquist,ws.v[n],w2);
  yr_vector.v = L.m;
  yr_vector._0_8_ = d.v;
  xSz = bisectv((swipe *)(ulong)(uint)d.x,yr_vector,2.0);
  vVar5 = makev(xSz);
  pdVar3 = vVar5.v;
  vVar6 = makev(xSz);
  pdVar4 = vVar6.v;
  uVar2 = 0;
  uVar1 = xSz;
  if ((int)xSz < 1) {
    uVar1 = 0;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pdVar4[uVar2] = pc.v[uVar2];
    pdVar3[uVar2] = 1.0 - ABS(d.v[uVar2] + -1.0);
  }
  mu._4_4_ = uStack_4c;
  mu.x = vVar5.x;
  pci._4_4_ = uStack_3c;
  pci.x = vVar6.x;
  fERBs_00._4_4_ = 0;
  fERBs_00.x = fERBs.x;
  pci.v = pdVar4;
  mu.v = pdVar3;
  fERBs_00.v = fERBs.v;
  Sadd(S,L,fERBs_00,pci,mu,ps,dt,nyquist2,0,xSz,w2);
  yr_matrix.m = extraout_RDX;
  yr_matrix._0_8_ = yr_vector.v;
  freem(L._0_8_,yr_matrix);
  yr_vector_00.v = extraout_RDX_00;
  yr_vector_00._0_8_ = pdVar3;
  freev((swipe *)(ulong)(uint)vVar5.x,yr_vector_00);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = pdVar4;
  freev((swipe *)(ulong)(uint)vVar6.x,yr_vector_01);
  return;
}

Assistant:

void Sfirst(matrix S, vector x, vector pc, vector fERBs, vector d, 
                                           intvector ws, intvector ps, 
                                           double nyquist, double nyquist2,
                                           double dt, int n) {
    int i; 
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = 0; // the start of Sfirst-specific code
    int hi = bisectv(d, 2.);
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    for (i = 0; i < hi; i++) {
        pci.v[i] = pc.v[i];
        mu.v[i] = 1. - fabs(d.v[i] - 1.);
    } // end of Sfirst-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}